

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall xmrig::Network::Network(Network *this,Controller *controller)

{
  bool hwAES;
  Config *pCVar1;
  CpuConfig *this_00;
  Api *this_01;
  IStrategy *pIVar2;
  Timer *this_02;
  
  (this->super_IJobResultListener)._vptr_IJobResultListener = (_func_int **)&PTR__Network_001bc6e8;
  (this->super_IStrategyListener)._vptr_IStrategyListener = (_func_int **)&DAT_001bc750;
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Network_001bc798;
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__Network_001bc7c0;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Network_001bc7e8;
  this->m_controller = controller;
  this->m_donate = (IStrategy *)0x0;
  NetworkState::NetworkState(&this->m_state);
  this->m_timer = (Timer *)0x0;
  pCVar1 = Base::config(&controller->super_Base);
  this_00 = Config::cpu(pCVar1);
  hwAES = CpuConfig::isHwAES(this_00);
  JobResults::setListener(&this->super_IJobResultListener,hwAES);
  Base::addListener(&controller->super_Base,&this->super_IBaseListener);
  this_01 = Base::api(&controller->super_Base);
  Api::addListener(this_01,&this->super_IApiListener);
  pCVar1 = Base::config(&controller->super_Base);
  pIVar2 = Pools::createStrategy(&(pCVar1->super_BaseConfig).m_pools,&this->super_IStrategyListener)
  ;
  this->m_strategy = pIVar2;
  this_02 = (Timer *)operator_new(0x10);
  Timer::Timer(this_02,&this->super_ITimerListener,1000,1000);
  this->m_timer = this_02;
  return;
}

Assistant:

xmrig::Network::Network(Controller *controller) :
    m_controller(controller),
    m_donate(nullptr),
    m_timer(nullptr)
{
    JobResults::setListener(this, controller->config()->cpu().isHwAES());
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    const Pools &pools = controller->config()->pools();
    m_strategy = pools.createStrategy(this);

    m_timer = new Timer(this, kTickInterval, kTickInterval);
}